

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O3

void nn_stcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type != -3 || src != -2) {
    if (*(int *)&self[1].fn == 7) goto LAB_001a6ff6;
    nn_stcp_shutdown_cold_1();
  }
  nn_pipebase_stop((nn_pipebase *)(self + 6));
  nn_streamhdr_stop((nn_streamhdr *)&self[1].state);
  *(undefined4 *)&self[1].fn = 7;
LAB_001a6ff6:
  nn_stcp_shutdown_cold_2();
  return;
}

Assistant:

static void nn_stcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_stcp *stcp;

    stcp = nn_cont (self, struct nn_stcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_pipebase_stop (&stcp->pipebase);
        nn_streamhdr_stop (&stcp->streamhdr);
        stcp->state = NN_STCP_STATE_STOPPING;
    }
    if (nn_slow (stcp->state == NN_STCP_STATE_STOPPING)) {
        if (nn_streamhdr_isidle (&stcp->streamhdr)) {
            nn_usock_swap_owner (stcp->usock, &stcp->usock_owner);
            stcp->usock = NULL;
            stcp->usock_owner.src = -1;
            stcp->usock_owner.fsm = NULL;
            stcp->state = NN_STCP_STATE_IDLE;
            nn_fsm_stopped (&stcp->fsm, NN_STCP_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state(stcp->state, src, type);
}